

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

ElemSegment * __thiscall wabt::Module::GetElemSegment(Module *this,Var *var)

{
  ElemSegment *pEVar1;
  Var *var_local;
  Module *this_local;
  
  pEVar1 = GetElemSegment(this,var);
  return pEVar1;
}

Assistant:

const ElemSegment* Module::GetElemSegment(const Var& var) const {
  return const_cast<Module*>(this)->GetElemSegment(var);
}